

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall embree::FilteredStatistics::add(FilteredStatistics *this,float a)

{
  float fVar1;
  iterator iVar2;
  iterator iVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  float *in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t i;
  size_t skip_large;
  size_t skip_small;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff28;
  Statistics *in_stack_ffffffffffffff30;
  Statistics *this_00;
  value_type_conflict *in_stack_ffffffffffffff38;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff40;
  size_type local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  
  std::vector<float,_std::allocator<float>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar2 = std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff28);
  iVar3 = std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff28);
  std::
  sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::less<float>>
            (iVar2._M_current,iVar3._M_current);
  dVar7 = (double)*in_RDI * 0.5;
  sVar4 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 2));
  auVar8._8_4_ = (int)(sVar4 >> 0x20);
  auVar8._0_8_ = sVar4;
  auVar8._12_4_ = 0x45300000;
  dVar7 = floor(dVar7 * ((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  local_70 = (long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f;
  fVar1 = in_RDI[1];
  sVar4 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)(in_RDI + 2));
  auVar9._8_4_ = (int)(sVar4 >> 0x20);
  auVar9._0_8_ = sVar4;
  auVar9._12_4_ = 0x45300000;
  dVar7 = floor((double)fVar1 * 0.5 *
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  Statistics::Statistics(in_stack_ffffffffffffff30);
  *(undefined8 *)(in_RDI + 8) = local_68;
  *(undefined8 *)(in_RDI + 10) = local_60;
  *(undefined8 *)(in_RDI + 0xc) = local_58;
  *(undefined8 *)(in_RDI + 0xe) = local_50;
  while( true ) {
    sVar4 = local_70;
    sVar5 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 2));
    if (sVar5 - ((long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f) <= sVar4
       ) break;
    this_00 = (Statistics *)(in_RDI + 8);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 2),local_70);
    Statistics::add(this_00,*pvVar6);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

void add(float a) 
    {
      v.push_back(a);
      std::sort(v.begin(),v.end(),std::less<float>());
      size_t skip_small = (size_t) floor(0.5*fskip_small*double(v.size()));
      size_t skip_large = (size_t) floor(0.5*fskip_large*double(v.size()));

      stat = Statistics();
      for (size_t i=skip_small; i<v.size()-skip_large; i++)
        stat.add(v[i]);
    }